

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write<char,fmt::v10::appender>
                   (appender out,char *s,format_specs<char> *specs,locale_ref param_4)

{
  unsigned_long value;
  char *pcVar1;
  locale_ref in_R9;
  basic_string_view<char> s_00;
  format_specs<char> *specs_local;
  char *s_local;
  locale_ref param_3_local;
  appender out_local;
  
  specs_local = (format_specs<char> *)s;
  s_local = (char *)param_4.locale_;
  param_3_local.locale_ =
       (void *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  if (specs->type == pointer) {
    value = bit_cast<unsigned_long,_const_char_*,_0>((char **)&specs_local);
    out_local = write_ptr<char,fmt::v10::appender,unsigned_long>(out,value,specs);
  }
  else {
    if (s == (char *)0x0) {
      throw_format_error("string pointer is null");
    }
    pcVar1 = (char *)strlen(s);
    s_00.size_ = (size_t)specs;
    s_00.data_ = pcVar1;
    out_local = write<char,fmt::v10::appender>
                          ((detail *)
                           out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                           ,(appender)s,s_00,(format_specs<char> *)0x0,in_R9);
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s,
                         const format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  if (specs.type == presentation_type::pointer)
    return write_ptr<Char>(out, bit_cast<uintptr_t>(s), &specs);
  if (!s) throw_format_error("string pointer is null");
  return write(out, basic_string_view<Char>(s), specs, {});
}